

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkSkeletonBlifMv(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  long *plVar8;
  Abc_Obj_t *pAVar9;
  void *pvVar10;
  int Fill;
  Vec_Int_t *p;
  int iBit;
  int iVar11;
  bool bVar12;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2de,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLIFMV) {
    __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2df,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x2e0,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] == 0) {
    Abc_NtkCleanCopy(pNtk);
    pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar3;
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pSpec = pcVar3;
    pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_WHITEBOX);
    for (iVar11 = 0; iVar11 < pNtk->vPis->nSize; iVar11 = iVar11 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,iVar11);
      Abc_NtkDupObj(pNtk_00,pAVar5,0);
      pAVar7 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
      Abc_NtkDupObj(pNtk_00,pAVar7,1);
      Abc_ObjAddFanin((pAVar7->field_6).pCopy,(pAVar5->field_6).pCopy);
    }
    for (iVar11 = 0; iVar11 < pNtk->vPos->nSize; iVar11 = iVar11 + 1) {
      pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos,iVar11);
      Abc_NtkDupObj(pNtk_00,pAVar6,0);
      pAVar7 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
      pAVar5 = (pAVar7->field_6).pCopy;
      if (pAVar5 == (Abc_Obj_t *)0x0) {
        Abc_NtkDupObj(pNtk_00,pAVar7,1);
        pAVar5 = (pAVar7->field_6).pCopy;
      }
      Abc_ObjAddFanin((pAVar6->field_6).pCopy,pAVar5);
    }
    iVar11 = 0;
    do {
      if (pNtk->vBoxes->nSize <= iVar11) {
        Abc_NtkIncrementTravId(pNtk);
        for (iVar11 = 0; iVar11 < pNtk->vCis->nSize; iVar11 = iVar11 + 1) {
          pAVar7 = Abc_NtkCi(pNtk,iVar11);
          pAVar7 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray];
          uVar1 = Abc_ObjMvVarNum(pAVar7);
          iVar2 = Abc_Base2Log(uVar1);
          iBit = 0;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          for (; iVar2 != iBit; iBit = iBit + 1) {
            pAVar5 = Abc_NtkCreateNode(pNtk_00);
            pcVar3 = Abc_SopEncoderLog((Mem_Flex_t *)pNtk_00->pManFunc,iBit,uVar1);
            (pAVar5->field_5).pData = pcVar3;
            pAVar6 = Abc_NtkCreateNet(pNtk_00);
            pAVar9 = Abc_NtkCreateBi(pNtk_00);
            Abc_ObjAddFanin(pAVar5,(pAVar7->field_6).pCopy);
            Abc_ObjAddFanin(pAVar6,pAVar5);
            Abc_ObjAddFanin(pAVar9,pAVar6);
            Abc_ObjAddFanin(pAVar4,pAVar9);
          }
          Abc_NodeSetTravIdCurrent(pAVar7);
        }
        for (iVar11 = 0; iVar11 < pNtk->vCos->nSize; iVar11 = iVar11 + 1) {
          pAVar7 = Abc_NtkCo(pNtk,iVar11);
          pAVar7 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
          p = &pAVar7->pNtk->vTravIds;
          iVar2 = pAVar7->Id;
          Vec_IntFillExtra(p,iVar2 + 1,Fill);
          iVar2 = Vec_IntEntry(p,iVar2);
          if (iVar2 != pAVar7->pNtk->nTravIds) {
            Abc_NodeSetTravIdCurrent(pAVar7);
            uVar1 = Abc_ObjMvVarNum(pAVar7);
            iVar2 = Abc_Base2Log(uVar1);
            pAVar5 = Abc_NtkCreateNode(pNtk_00);
            pcVar3 = Abc_SopDecoderLog((Mem_Flex_t *)pNtk_00->pManFunc,uVar1);
            (pAVar5->field_5).pData = pcVar3;
            if (iVar2 < 1) {
              iVar2 = 0;
            }
            while (bVar12 = iVar2 != 0, iVar2 = iVar2 + -1, bVar12) {
              pAVar6 = Abc_NtkCreateBo(pNtk_00);
              pAVar9 = Abc_NtkCreateNet(pNtk_00);
              Abc_ObjAddFanin(pAVar6,pAVar4);
              Abc_ObjAddFanin(pAVar9,pAVar6);
              Abc_ObjAddFanin(pAVar5,pAVar9);
            }
            Abc_ObjAddFanin((pAVar7->field_6).pCopy,pAVar5);
          }
        }
        if (pNtk->ntkFunc == ABC_FUNC_BLIFMV) {
          pvVar10 = Abc_NtkMvVar(pNtk);
          if (pvVar10 != (void *)0x0) {
            pvVar10 = Abc_NtkMvVar(pNtk_00);
            if (pvVar10 == (void *)0x0) {
              Abc_NtkStartMvVars(pNtk_00);
            }
            for (iVar11 = 0; iVar11 < pNtk->vObjs->nSize; iVar11 = iVar11 + 1) {
              pAVar4 = Abc_NtkObj(pNtk,iVar11);
              if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 6)) &&
                 (pAVar7 = (pAVar4->field_6).pCopy, pAVar7 != (Abc_Obj_t *)0x0)) {
                iVar2 = Abc_ObjMvVarNum(pAVar4);
                Abc_NtkSetMvVarValues(pAVar7,iVar2);
              }
            }
          }
        }
        iVar11 = Abc_NtkCheck(pNtk_00);
        if (iVar11 == 0) {
          fwrite("Abc_NtkSkeletonBlifMv(): Network check has failed.\n",0x33,1,_stdout);
          Abc_NtkDelete(pNtk_00);
          pNtk_00 = (Abc_Ntk_t *)0x0;
        }
        return pNtk_00;
      }
      pAVar7 = Abc_NtkBox(pNtk,iVar11);
      if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
        Abc_NtkDupBox(pNtk_00,pAVar7,0);
        plVar8 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray];
        pAVar5 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[6] * 8);
        if ((pAVar5->field_6).pTemp != (void *)0x0) {
          __assert_fail("pNet->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                        ,0x304,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
        }
        Abc_NtkDupObj(pNtk_00,pAVar5,1);
        Abc_ObjAddFanin((pAVar5->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray] + 0x40));
        plVar8 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
        pAVar5 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8);
        pAVar6 = (pAVar5->field_6).pCopy;
        if (pAVar6 == (Abc_Obj_t *)0x0) {
          Abc_NtkDupObj(pNtk_00,pAVar5,1);
          plVar8 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
          pAVar6 = (pAVar5->field_6).pCopy;
        }
        Abc_ObjAddFanin((Abc_Obj_t *)plVar8[8],pAVar6);
      }
      iVar11 = iVar11 + 1;
    } while( true );
  }
  __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                ,0x2e1,"Abc_Ntk_t *Abc_NtkSkeletonBlifMv(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSkeletonBlifMv( Abc_Ntk_t * pNtk )
{
    int fUsePositional = 0;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNet, * pNetNew, * pNodeNew, * pTermNew, * pBoxNew;
    int i, k, v, nValues, nBits;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pName );
    // create the internal box (it is important to put it first!)
    pBoxNew = Abc_NtkCreateWhitebox( pNtkNew );
    // create PIs and their nets
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pNet = Abc_ObjFanout0(pObj);
        Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pNet->pCopy, pObj->pCopy );
    }
    // create POs and their nets
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pNet = Abc_ObjFanin0(pObj);
        if ( pNet->pCopy == NULL )
            Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pObj->pCopy, pNet->pCopy );
    }
    // create latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
        // latch outputs
        pNet = Abc_ObjFanout0(Abc_ObjFanout0(pObj));
        assert( pNet->pCopy == NULL );
        Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( pNet->pCopy, Abc_ObjFanout0(pObj)->pCopy );
        // latch inputs
        pNet = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        if ( pNet->pCopy == NULL )
            Abc_NtkDupObj( pNtkNew, pNet, 1 );
        Abc_ObjAddFanin( Abc_ObjFanin0(pObj)->pCopy, pNet->pCopy );
    }

    // encode the CI nets
    Abc_NtkIncrementTravId( pNtk );
    if ( fUsePositional )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            for ( v = 0; v < nValues; v++ )
            {
                pNodeNew = Abc_NtkCreateNode( pNtkNew );
                pNodeNew->pData = Abc_SopEncoderPos( (Mem_Flex_t *)pNtkNew->pManFunc, v, nValues );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                pTermNew = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pNodeNew, pNet->pCopy );
                Abc_ObjAddFanin( pNetNew, pNodeNew );
                Abc_ObjAddFanin( pTermNew, pNetNew );
                Abc_ObjAddFanin( pBoxNew, pTermNew );
            }
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pNodeNew = Abc_NtkCreateNode( pNtkNew );
                pNodeNew->pData = Abc_SopEncoderLog( (Mem_Flex_t *)pNtkNew->pManFunc, k, nValues );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                pTermNew = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pNodeNew, pNet->pCopy );
                Abc_ObjAddFanin( pNetNew, pNodeNew );
                Abc_ObjAddFanin( pTermNew, pNetNew );
                Abc_ObjAddFanin( pBoxNew, pTermNew );
            }
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }

    // encode the CO nets
    if ( fUsePositional )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
            if ( Abc_NodeIsTravIdCurrent(pNet) )
                continue;
            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopDecoderPos( (Mem_Flex_t *)pNtkNew->pManFunc, nValues );
            for ( v = 0; v < nValues; v++ )
            {
                pTermNew = Abc_NtkCreateBo( pNtkNew );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                Abc_ObjAddFanin( pTermNew, pBoxNew );
                Abc_ObjAddFanin( pNetNew, pTermNew );
                Abc_ObjAddFanin( pNodeNew, pNetNew );
            }
            Abc_ObjAddFanin( pNet->pCopy, pNodeNew );
        }
    }
    else
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
            if ( Abc_NodeIsTravIdCurrent(pNet) )
                continue;
            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            nBits = Abc_Base2Log( nValues );
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopDecoderLog( (Mem_Flex_t *)pNtkNew->pManFunc, nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pTermNew = Abc_NtkCreateBo( pNtkNew );
                pNetNew = Abc_NtkCreateNet( pNtkNew );
                Abc_ObjAddFanin( pTermNew, pBoxNew );
                Abc_ObjAddFanin( pNetNew, pTermNew );
                Abc_ObjAddFanin( pNodeNew, pNetNew );
            }
            Abc_ObjAddFanin( pNet->pCopy, pNodeNew );
        }
    }

    // if it is a BLIF-MV netlist transfer the values of all nets
    if ( Abc_NtkHasBlifMv(pNtk) && Abc_NtkMvVar(pNtk) )
    {
        if ( Abc_NtkMvVar( pNtkNew ) == NULL )
            Abc_NtkStartMvVars( pNtkNew );
        Abc_NtkForEachNet( pNtk, pObj, i )
            if ( pObj->pCopy )
                Abc_NtkSetMvVarValues( pObj->pCopy, Abc_ObjMvVarNum(pObj) );
    }

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkSkeletonBlifMv(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}